

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderparser.cpp
# Opt level: O2

bool ShaderParserParse(string *base_path,string *path,
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *watches,vector<RenderPass,_std::allocator<RenderPass>_> *render_passes,
                      vector<GUIComponent,_std::allocator<GUIComponent>_> *components,
                      string *read_file_error)

{
  char cVar1;
  pointer pRVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  string *line_00;
  ulong uVar6;
  uint current_char;
  uint32_t local_24c;
  pointer local_248;
  anon_class_8_1_efc841ae report_error;
  string prev_line;
  string line;
  vector<Texture,_std::allocator<Texture>_> textures;
  string source;
  vector<GUIComponent,_std::allocator<GUIComponent>_> new_components;
  RenderPass new_pass;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  string amalgamate;
  vector<GUIComponent,_std::allocator<GUIComponent>_> previous_components;
  string gui_component_line;
  ulong uVar7;
  
  amalgamate._M_dataplus._M_p = (pointer)&amalgamate.field_2;
  amalgamate._M_string_length = 0;
  amalgamate.field_2._M_local_buf[0] = '\0';
  bVar4 = ShaderParserAmalgamate(base_path,path,watches,read_file_error,&amalgamate);
  if (!bVar4) {
    bVar4 = false;
LAB_00120544:
    std::__cxx11::string::~string((string *)&amalgamate);
    return bVar4;
  }
  new_components.super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_components.super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  new_components.super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<GUIComponent,_std::allocator<GUIComponent>_>::vector(&previous_components,components);
  source._M_dataplus._M_p = (pointer)&source.field_2;
  source._M_string_length = 0;
  prev_line._M_dataplus._M_p = (pointer)&prev_line.field_2;
  prev_line._M_string_length = 0;
  source.field_2._M_local_buf[0] = '\0';
  prev_line.field_2._M_local_buf[0] = '\0';
  textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_24c = 0;
  local_248 = (pointer)0x0;
  uVar6 = 0;
  report_error.read_file_error = read_file_error;
  while (_Var3._M_p = prev_line._M_dataplus._M_p, uVar6 < amalgamate._M_string_length) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    uVar7 = uVar6;
    while (_Var3._M_p = line._M_dataplus._M_p, uVar6 = uVar7 + 1,
          amalgamate._M_dataplus._M_p[uVar7] != '\n') {
      std::__cxx11::string::push_back((char)&line);
      uVar7 = uVar6;
    }
    uVar7 = 0xffffffff;
    do {
      current_char = (int)uVar7 + 1;
      uVar7 = (ulong)current_char;
      iVar5 = isspace((int)_Var3._M_p[uVar7]);
    } while (iVar5 != 0);
    if ((uVar7 < prev_line._M_string_length) && (prev_line._M_dataplus._M_p[uVar7] == '@')) {
      std::__cxx11::string::substr((ulong)&new_pass,(ulong)&prev_line);
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &new_pass,"path");
      std::__cxx11::string::~string((string *)&new_pass);
      if (bVar4) {
        local_a8._8_8_ = 0;
        local_a8._M_unused._M_object = report_error.read_file_error;
        local_90 = std::
                   _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/shaderparser.cpp:163:25)>
                   ::_M_invoke;
        local_98 = std::
                   _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/shaderparser.cpp:163:25)>
                   ::_M_manager;
        bVar4 = ShaderParserParseTextures
                          (base_path,&prev_line,&line,current_char,local_24c,
                           (FErrorReport *)&local_a8,watches,&textures);
        std::_Function_base::~_Function_base((_Function_base *)&local_a8);
joined_r0x00120078:
        if (bVar4) goto LAB_00120361;
LAB_0012007e:
        bVar4 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)&new_pass,(ulong)&prev_line);
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&new_pass,"pass_end");
        std::__cxx11::string::~string((string *)&new_pass);
        if (!bVar4) {
          std::__cxx11::string::substr((ulong)&new_pass,(ulong)&prev_line);
          line_00 = (string *)0x1581ff;
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&new_pass,"pass");
          std::__cxx11::string::~string((string *)&new_pass);
          if (bVar4) {
            new_pass._8_8_ = new_pass._8_8_ & 0xffffffff00000000;
            new_pass.Program.Handle = 0;
            new_pass.Program.FragmentShaderHandle = 0;
            new_pass.Textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            new_pass.Textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            new_pass.Textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            new_pass.ShaderSource._M_dataplus._M_p = (pointer)&new_pass.ShaderSource.field_2;
            new_pass.ShaderSource._M_string_length = 0;
            new_pass.ShaderSource.field_2._M_allocated_capacity =
                 new_pass.ShaderSource.field_2._M_allocated_capacity & 0xffffffffffffff00;
            new_pass.Input._M_dataplus._M_p = (pointer)&new_pass.Input.field_2;
            new_pass.Input._M_string_length = 0;
            new_pass.Input.field_2._M_local_buf[0] = '\0';
            new_pass.Output._M_dataplus._M_p = (pointer)&new_pass.Output.field_2;
            new_pass.Output._M_string_length = 0;
            new_pass.Output.field_2._M_local_buf[0] = '\0';
            new_pass.IsMain = false;
            new_pass.Width = 0;
            new_pass.Height = 0;
            new_pass.FBO = 0;
            new_pass.TextureId = 0;
            local_c8._8_8_ = 0;
            local_c8._M_unused._M_object = report_error.read_file_error;
            local_b0 = std::
                       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/shaderparser.cpp:163:25)>
                       ::_M_invoke;
            local_b8 = std::
                       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/shaderparser.cpp:163:25)>
                       ::_M_manager;
            bVar4 = ShaderParserParseRenderPass
                              (&prev_line,line_00,current_char,local_24c,(FErrorReport *)&local_c8,
                               &new_pass);
            std::_Function_base::~_Function_base((_Function_base *)&local_c8);
            if (bVar4) {
              std::vector<RenderPass,_std::allocator<RenderPass>_>::push_back
                        (render_passes,&new_pass);
              local_248 = (render_passes->
                          super__Vector_base<RenderPass,_std::allocator<RenderPass>_>)._M_impl.
                          super__Vector_impl_data._M_finish + -1;
            }
            RenderPass::~RenderPass(&new_pass);
            goto joined_r0x00120078;
          }
          new_pass.ShaderSource._M_string_length = 0;
          new_pass.ShaderSource.field_2._M_allocated_capacity = 0;
          new_pass.Textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          new_pass.ShaderSource._M_dataplus._M_p = (pointer)0x0;
          new_pass.Textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          new_pass.Textures.super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          new_pass.Program.Handle = 0;
          new_pass.Program.FragmentShaderHandle = 0;
          new_pass.Program.VertexShaderHandle = 0;
          new_pass._12_4_ = 0;
          new_pass.ShaderSource.field_2._8_8_ = 0;
          std::__cxx11::string::substr((ulong)&gui_component_line,(ulong)&prev_line);
          bVar4 = GUIComponentParse(local_24c,&gui_component_line,&line,&previous_components,
                                    (GUIComponent *)&new_pass,read_file_error);
          if (bVar4) {
            std::vector<GUIComponent,_std::allocator<GUIComponent>_>::push_back
                      (&new_components,(value_type *)&new_pass);
            std::__cxx11::string::~string((string *)&gui_component_line);
            std::__cxx11::string::~string((string *)&new_pass.Program.VertexShaderHandle);
            goto LAB_00120361;
          }
          std::__cxx11::string::~string((string *)&gui_component_line);
          std::__cxx11::string::~string((string *)&new_pass.Program.VertexShaderHandle);
          goto LAB_0012007e;
        }
        if (local_248 != (pointer)0x0) {
          std::__cxx11::string::operator=((string *)&local_248->ShaderSource,(string *)&source);
          std::vector<Texture,_std::allocator<Texture>_>::_M_move_assign
                    (&local_248->Textures,&textures);
          source._M_string_length = 0;
          *source._M_dataplus._M_p = '\0';
          std::vector<Texture,_std::allocator<Texture>_>::clear(&textures);
          local_248 = (pointer)0x0;
          goto LAB_00120361;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&new_pass,"@pass_end was declared without @pass",
                   (allocator<char> *)&gui_component_line);
        ShaderParserParse::anon_class_8_1_efc841ae::operator()
                  (&report_error,(string *)&new_pass,local_24c);
        std::__cxx11::string::~string((string *)&new_pass);
        bVar4 = false;
        local_248 = (pointer)0x0;
      }
    }
    else {
LAB_00120361:
      if (line._M_dataplus._M_p[uVar7] != '@') {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &new_pass,&line,"\n");
        std::__cxx11::string::append((string *)&source);
        std::__cxx11::string::~string((string *)&new_pass);
      }
      std::__cxx11::string::_M_assign((string *)&prev_line);
      local_24c = local_24c + 1;
      bVar4 = true;
    }
    std::__cxx11::string::~string((string *)&line);
    if (!bVar4) goto LAB_00120504;
  }
  if (local_248 == (pointer)0x0) {
    if ((render_passes->super__Vector_base<RenderPass,_std::allocator<RenderPass>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (render_passes->super__Vector_base<RenderPass,_std::allocator<RenderPass>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<RenderPass,_std::allocator<RenderPass>_>::emplace_back<>(render_passes);
      std::__cxx11::string::operator=
                ((string *)
                 &(render_passes->super__Vector_base<RenderPass,_std::allocator<RenderPass>_>).
                  _M_impl.super__Vector_impl_data._M_finish[-1].ShaderSource,(string *)&source);
      pRVar2 = (render_passes->super__Vector_base<RenderPass,_std::allocator<RenderPass>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pRVar2[-1].IsMain = true;
      std::vector<Texture,_std::allocator<Texture>_>::operator=(&pRVar2[-1].Textures,&textures);
    }
    goto LAB_00120496;
  }
  uVar6 = 0;
  do {
    uVar7 = uVar6;
    cVar1 = _Var3._M_p[uVar7];
    iVar5 = isspace((int)cVar1);
    uVar6 = (ulong)((int)uVar7 + 1);
  } while (iVar5 != 0);
  if ((cVar1 == '@') && (uVar7 < prev_line._M_string_length)) goto code_r0x0012041e;
  std::operator+(&line,"Render pass ",&local_248->Output);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&new_pass,
                 &line," was declared without @pass_end");
  std::__cxx11::string::operator=((string *)read_file_error,(string *)&new_pass);
  std::__cxx11::string::~string((string *)&new_pass);
  std::__cxx11::string::~string((string *)&line);
LAB_00120504:
  bVar4 = false;
LAB_00120506:
  std::vector<Texture,_std::allocator<Texture>_>::~vector(&textures);
  std::__cxx11::string::~string((string *)&prev_line);
  std::__cxx11::string::~string((string *)&source);
  std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector(&previous_components);
  std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector(&new_components);
  goto LAB_00120544;
code_r0x0012041e:
  std::__cxx11::string::operator=((string *)&local_248->ShaderSource,(string *)&source);
  std::vector<Texture,_std::allocator<Texture>_>::_M_move_assign(&local_248->Textures,&textures);
LAB_00120496:
  std::vector<GUIComponent,_std::allocator<GUIComponent>_>::_M_move_assign
            (components,&new_components);
  bVar4 = true;
  goto LAB_00120506;
}

Assistant:

bool ShaderParserParse(const std::string& base_path, const std::string& path, std::vector<std::string>& watches, std::vector<RenderPass>& render_passes, std::vector<GUIComponent>& components, std::string& read_file_error) {
    std::string amalgamate;

    if (!ShaderParserAmalgamate(base_path, path, watches, read_file_error, amalgamate)) {
        return false;
    }

    std::vector<GUIComponent> new_components;
    std::vector<GUIComponent> previous_components = components;

    uint32_t line_number = 0;
    std::string source;
    std::string prev_line;
    std::vector<Texture> textures;
    RenderPass* pass = nullptr;

    auto report_error = [&](const std::string& error, uint32_t line_number) {
        read_file_error = error + " at line " + std::to_string(line_number);
    };

    for (size_t i = 0; i < amalgamate.size(); ++i) {
        std::string line;

        while (amalgamate[i] != '\n') {
            line += amalgamate[i];
            ++i;
        }

        uint32_t current_char = 0;
        while (isspace(line[current_char])) {
            ++current_char;
        }

        if (current_char < prev_line.length() && prev_line[current_char] == '@') {
            if (prev_line.substr(current_char + 1, current_char + 4) == "path") {
                if (!ShaderParserParseTextures(base_path, prev_line, line, current_char, line_number, report_error, watches, textures)) {
                    return false;
                }
            } else if (prev_line.substr(current_char + 1, current_char + 8) == "pass_end") {
                if (!pass) {
                    report_error("@pass_end was declared without @pass", line_number);
                    return false;
                }

                pass->ShaderSource = std::move(source);
                pass->Textures = std::move(textures);

                source.clear();
                textures.clear();

                pass = nullptr;
            } else if (prev_line.substr(current_char + 1, current_char + 4) == "pass") {
                RenderPass new_pass;
                if (!ShaderParserParseRenderPass(prev_line, line, current_char, line_number, report_error, new_pass)) {
                    return false;
                }

                render_passes.push_back(new_pass);
                pass = &render_passes.back();
            } else {
                GUIComponent component;
                std::string gui_component_line = prev_line.substr(current_char + 1, std::string::npos);
                if (!GUIComponentParse(line_number, gui_component_line, line, previous_components, component, read_file_error)) {
                    return false;
                }

                new_components.push_back(component);
            }
        }

        if (line[current_char] != '@') {
            source += line + "\n";
        }

        prev_line = line;
        ++line_number;
    }

    if (pass) {
        uint32_t current_char = 0;
        while (isspace(prev_line[current_char])) {
            ++current_char;
        }
        if (current_char < prev_line.length() && prev_line[current_char] == '@') {
            pass->ShaderSource = std::move(source);
            pass->Textures = std::move(textures);
        } else {
            read_file_error = "Render pass " + pass->Output + " was declared without @pass_end";
            return false;
        }
    } else  if (render_passes.empty()) {
        render_passes.emplace_back();
        render_passes.back().ShaderSource = std::move(source);
        render_passes.back().IsMain = true;
        render_passes.back().Textures = textures;
    }

    components = std::move(new_components);

    return true;
}